

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O3

bool __thiscall pg::PSISolver::si_val_less(PSISolver *this,int a,int b)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  if ((a == b) ||
     ((a != -1 && ((*(int *)(won + (long)a * 4) != 0 || (*(int *)(done + (long)a * 4) == 2)))))) {
    iVar1 = 0;
  }
  else {
    if (b != -1) {
      iVar1 = 1;
      if ((*(int *)(won + (long)b * 4) != 0) || (*(int *)(done + (long)b * 4) == 2))
      goto LAB_0015b460;
    }
    uVar2 = (ulong)k;
    while (iVar1 = 0, 0 < (int)uVar2) {
      if (a != -1) {
        iVar1 = *(int *)(val + -4 + (long)(int)(k * a) * 4 + uVar2 * 4);
      }
      if (b == -1) {
        iVar3 = 0;
      }
      else {
        iVar3 = *(int *)(val + -4 + (long)(int)(k * b) * 4 + uVar2 * 4);
      }
      uVar2 = uVar2 - 1;
      if (iVar1 != iVar3) {
        if ((uVar2 & 1) == 0) {
          return iVar1 < iVar3;
        }
        return iVar3 < iVar1;
      }
    }
  }
LAB_0015b460:
  return SUB41(iVar1,0);
}

Assistant:

bool
PSISolver::si_val_less(int a, int b)
{
    // if a == b, then of course return false
    if (a == b) return false;
    // if a is won or on even cycle, then "a >= b"
    if (a != -1 && (won[a] || done[a] == 2)) return false;
    // if b is won or on even cycle and a is not, then "a < b"
    if (b != -1 && (won[b] || done[b] == 2)) return true;
    // neither a/b are won/on even cycle
    int *a_val = a == -1 ? NULL : val + k*a;
    int *b_val = b == -1 ? NULL : val + k*b;
    // find highest priority where they differ
    for (int i=k-1; i>=0; i--) {
        const int a_i = a == -1 ? 0 : a_val[i];
        const int b_i = b == -1 ? 0 : b_val[i];
        if (a_i == b_i) continue;
        if (i&1) return a_i > b_i; // for odd priorities
        else return a_i < b_i;     // for even priorities
    }
    // equal
    return false;
}